

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_rst_stream_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int32_t stream_id;
  int iVar1;
  int iVar2;
  nghttp2_stream *stream;
  uint64_t tstamp;
  char *reason;
  
  stream_id = (frame->hd).stream_id;
  if (stream_id == 0) {
    reason = "RST_STREAM: stream_id == 0";
  }
  else {
    iVar1 = session_detect_idle_stream(session,stream_id);
    if (iVar1 == 0) {
      stream = nghttp2_session_get_stream(session,stream_id);
      if (stream != (nghttp2_stream *)0x0) {
        nghttp2_stream_shutdown(stream,NGHTTP2_SHUT_RD);
      }
      iVar1 = session_call_on_frame_received(session,frame);
      if ((((iVar1 == 0) &&
           (iVar1 = nghttp2_session_close_stream
                              (session,(frame->hd).stream_id,(frame->rst_stream).error_code),
           -0x385 < iVar1)) && (iVar1 = 0, session->server != '\0')) &&
         ((session->goaway_flags & 0x10) == 0)) {
        tstamp = nghttp2_time_now_sec();
        nghttp2_ratelim_update(&session->stream_reset_ratelim,tstamp);
        iVar2 = nghttp2_ratelim_drain(&session->stream_reset_ratelim,1);
        if (iVar2 != 0) {
          iVar1 = nghttp2_session_add_goaway
                            (session,session->last_recv_stream_id,2,(uint8_t *)0x0,0,'\0');
          return iVar1;
        }
      }
      return iVar1;
    }
    reason = "RST_STREAM: stream in idle";
  }
  iVar1 = session_handle_invalid_connection(session,frame,-0x1f9,reason);
  return iVar1;
}

Assistant:

int nghttp2_session_on_rst_stream_received(nghttp2_session *session,
                                           nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;
  if (frame->hd.stream_id == 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "RST_STREAM: stream_id == 0");
  }

  if (session_detect_idle_stream(session, frame->hd.stream_id)) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "RST_STREAM: stream in idle");
  }

  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (stream) {
    /* We may use stream->shut_flags for strict error checking. */
    nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_RD);
  }

  rv = session_call_on_frame_received(session, frame);
  if (rv != 0) {
    return rv;
  }
  rv = nghttp2_session_close_stream(session, frame->hd.stream_id,
                                    frame->rst_stream.error_code);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return session_update_stream_reset_ratelim(session);
}